

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O2

bool log_is_valid_callstack(int callstack_depth,void **callstack,bool is_alloc)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  undefined7 in_register_00000011;
  int iVar6;
  ulong uVar7;
  void *addr;
  string objfile;
  Dl_info dlinfo;
  allocator local_ad;
  undefined4 local_ac;
  void *local_a8;
  void **local_a0;
  char *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char *local_70 [4];
  string local_50 [32];
  
  local_ac = (undefined4)CONCAT71(in_register_00000011,is_alloc);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar7 = (ulong)(uint)callstack_depth;
  local_a0 = callstack;
  do {
    iVar6 = (int)uVar7;
    if (iVar6 < 2) goto LAB_0010aa29;
    local_a8 = callstack[uVar7 - 1];
    iVar3 = std::
            _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&objfile_cache_abi_cxx11_->_M_t,&local_a8);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(objfile_cache_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header) {
      iVar2 = dladdr(local_a8,local_70);
      if ((local_70[0] != (char *)0x0 && iVar2 != 0) &&
         (pcVar4 = strdup(local_70[0]), pcVar4 != (char *)0x0)) {
        local_98 = pcVar4;
        pcVar4 = __xpg_basename(pcVar4);
        std::__cxx11::string::string(local_50,pcVar4,&local_ad);
        std::__cxx11::string::operator=((string *)&local_90,local_50);
        std::__cxx11::string::~string(local_50);
        pmVar5 = std::
                 map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](objfile_cache_abi_cxx11_,&local_a8);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        free(local_98);
        callstack = local_a0;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    uVar7 = uVar7 - 1;
  } while (local_90._M_string_length == 0);
  if ((iVar6 < 2 || (char)local_ac != '\0') ||
     (bVar1 = std::operator==(&local_90,"libobjc.A.dylib"), !bVar1)) {
LAB_0010aa29:
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_90);
  return bVar1;
}

Assistant:

bool log_is_valid_callstack(int callstack_depth, void * const callstack[], bool is_alloc)
{
  int i = callstack_depth - 1;
  std::string objfile;
  while (i > 0)
  {
    void *addr = callstack[i];

    auto it = objfile_cache->find(addr);
    if (it != objfile_cache->end())
    {
      objfile = it->second;
    }
    else
    {
      Dl_info dlinfo;
      if (dladdr(addr, &dlinfo) && dlinfo.dli_fname)
      {
        char *fname = strdup(dlinfo.dli_fname);
        if (fname)
        {
          objfile = std::string(basename(fname));
          (*objfile_cache)[addr] = objfile;
          free(fname);
        }
      }
    }

    if (!objfile.empty())
    {
      // For now only care about originating object file
      break;
    }
      
    --i;
  }

  if (!objfile.empty())
  {
      // ignore invalid dealloc from libobjc
      if (!is_alloc && (objfile == "libobjc.A.dylib")) return false;
  }

  return true;
}